

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

int __thiscall MT32Emu::Synth::open(Synth *this,char *__file,int __oflag,...)

{
  Bit8u *pBVar1;
  ushort count;
  RendererType RVar2;
  ControlROMMap *pCVar3;
  MemParams *pMVar4;
  Extensions *pEVar5;
  PatchParam *pPVar6;
  bool bVar7;
  Bit16s *pBVar8;
  PartialManager *this_00;
  PCMWaveEntry *pPVar9;
  long lVar10;
  char (*newSoundGroupNames) [9];
  RhythmPart *this_01;
  Part *this_02;
  MidiEventQueue *this_03;
  Analog *pAVar11;
  Renderer *pRVar12;
  Display *this_04;
  Bit32u in_ECX;
  ulong uVar13;
  size_t sVar14;
  undefined8 in_R8;
  int i_1;
  long lVar15;
  
  if (this->opened != false) {
    return 0;
  }
  this->partialCount = in_ECX;
  this->abortingPoly = (Poly *)0x0;
  this->extensions->abortingPartIx = 0;
  memset(this->mt32ram,0x3f,0x10dab);
  bVar7 = loadControlROM(this,(ROMImage *)__file);
  if (bVar7) {
    initMemoryRegions(this);
    sVar14 = (ulong)(this->controlROMMap->pcmCount == 0x100) * 0x40000 + 0x40000;
    this->pcmROMSize = sVar14;
    pBVar8 = (Bit16s *)operator_new__((ulong)(uint)((int)sVar14 * 2));
    this->pcmROMData = pBVar8;
    bVar7 = loadPCMROM(this,___oflag);
    if (bVar7) {
      initReverbModels(this,(bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 10) & 1
                                  ));
      pCVar3 = this->controlROMMap;
      bVar7 = initTimbres(this,pCVar3->timbreAMap,pCVar3->timbreAOffset,0x40,0,
                          pCVar3->timbreACompressed);
      if (bVar7) {
        pCVar3 = this->controlROMMap;
        bVar7 = initTimbres(this,pCVar3->timbreBMap,pCVar3->timbreBOffset,0x40,0x40,
                            pCVar3->timbreBCompressed);
        if ((bVar7) &&
           (bVar7 = initTimbres(this,this->controlROMMap->timbreRMap,0,
                                this->controlROMMap->timbreRCount,0xc0,true), bVar7)) {
          if (this->controlROMMap->timbreRCount == 0x1e) {
            memcpy(this->mt32ram->timbres + 0xde,this->mt32ram->timbres + 0xc0,0x1e00);
            memset(this->mt32ram->timbres + 0xfc,0,0x400);
          }
          memset(this->mt32ram->timbres + 0x80,0,0x4000);
          this_00 = (PartialManager *)operator_new(0x40);
          PartialManager::PartialManager(this_00,this,this->parts);
          this->partialManager = this_00;
          pCVar3 = this->controlROMMap;
          count = pCVar3->pcmCount;
          pPVar9 = (PCMWaveEntry *)operator_new__((ulong)count * 0x18);
          this->pcmWaves = pPVar9;
          initPCMList(this,pCVar3->pcmTable,count);
          memcpy(this->mt32ram->rhythmTemp,
                 this->controlROMData + this->controlROMMap->rhythmSettings,
                 (ulong)this->controlROMMap->rhythmSettingsCount << 2);
          pMVar4 = this->mt32ram;
          for (uVar13 = 0; uVar13 != 0x80; uVar13 = uVar13 + 1) {
            pMVar4->patches[uVar13].timbreGroup = (byte)((uVar13 & 0xffffffff) >> 6) & 3;
            pMVar4->patches[uVar13].timbreNum = (byte)uVar13 & 0x3f;
            pPVar6 = pMVar4->patches + uVar13;
            pPVar6->keyShift = '\x18';
            pPVar6->fineTune = '2';
            pPVar6->benderRange = '\f';
            pPVar6->assignMode = '\0';
            pMVar4->patches[uVar13].reverbSwitch = '\x01';
            pMVar4->patches[uVar13].dummy = '\0';
          }
          (pMVar4->system).masterTune = 'J';
          (pMVar4->system).reverbMode = '\0';
          (pMVar4->system).reverbTime = '\x05';
          (pMVar4->system).reverbLevel = '\x03';
          uVar13 = (ulong)this->controlROMMap->reserveSettings;
          (pMVar4->system).reserveSettings[8] = this->controlROMData[uVar13 + 8];
          *(undefined8 *)(pMVar4->system).reserveSettings =
               *(undefined8 *)(this->controlROMData + uVar13);
          for (lVar10 = -9; lVar10 != 0; lVar10 = lVar10 + 1) {
            (this->mt32ram->system).chanAssign[lVar10 + 9] = (char)lVar10 + '\n';
          }
          (this->mt32ram->system).masterVol = 'd';
          bVar7 = this->reverbOverridden;
          this->reverbOverridden = false;
          refreshSystem(this);
          this->extensions->masterTunePitchDelta = 0;
          this->reverbOverridden = bVar7;
          newSoundGroupNames =
               (char (*) [9])operator_new__((ulong)this->controlROMMap->soundGroupsCount * 9);
          this->soundGroupNames = newSoundGroupNames;
          initSoundGroups(this,newSoundGroupNames);
          lVar10 = 0xb;
          for (lVar15 = 0; pMVar4 = this->mt32ram, lVar15 != 9; lVar15 = lVar15 + 1) {
            *(undefined8 *)(pMVar4->patchTemp[0].dummyv + lVar10 + -0x15) = 0x1000c32180000;
            pMVar4->patchTemp[0].dummyv[lVar10 + -0xd] = 'P';
            pMVar4->patchTemp[0].dummyv[lVar10 + -0xc] =
                 this->controlROMData[lVar15 + (ulong)this->controlROMMap->panSettings];
            pBVar1 = pMVar4->patchTemp[0].dummyv + lVar10 + -0xb;
            pBVar1[0] = '\0';
            pBVar1[1] = '\0';
            pBVar1[2] = '\0';
            pBVar1[3] = '\0';
            pBVar1 = pMVar4->patchTemp[0].dummyv + lVar10 + -7;
            pBVar1[0] = '\0';
            pBVar1[1] = '\0';
            pMVar4->patchTemp[0].dummyv[lVar10 + -10] = '\x7f';
            if (lVar15 == 8) {
              this_01 = (RhythmPart *)operator_new(0x8c30);
              RhythmPart::RhythmPart(this_01,this,8);
              this->parts[8] = (Part *)this_01;
            }
            else {
              this_02 = (Part *)operator_new(0x208);
              Part::Part(this_02,this,(uint)lVar15);
              this->parts[lVar15] = this_02;
              (*this_02->_vptr_Part[5])
                        (this_02,(ulong)this->controlROMData
                                        [lVar15 + (ulong)this->controlROMMap->programSettings]);
            }
            lVar10 = lVar10 + 0x10;
          }
          memcpy(this->mt32default,pMVar4,0x10dab);
          this_03 = (MidiEventQueue *)operator_new(0x20);
          MidiEventQueue::MidiEventQueue
                    (this_03,this->extensions->midiEventQueueSize,
                     this->extensions->midiEventQueueSysexStorageBufferSize);
          this->midiQueue = this_03;
          pAVar11 = Analog::createAnalog
                              ((AnalogOutputMode)in_R8,
                               (bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 0xb)
                                     & 1),this->extensions->selectedRendererType);
          this->analog = pAVar11;
          setOutputGain(this,this->outputGain);
          setReverbOutputGain(this,this->reverbOutputGain);
          RVar2 = this->extensions->selectedRendererType;
          if (RVar2 == RendererType_BIT16S) {
            pRVar12 = (Renderer *)operator_new(0xc040);
            pRVar12->synth = this;
            pRVar12->_vptr_Renderer = (_func_int **)&PTR__Renderer_001aadc0;
            pRVar12[0xc01]._vptr_Renderer = (_func_int **)(pRVar12 + 1);
            pRVar12[0xc01].synth = (Synth *)(pRVar12 + 0x201);
            pRVar12[0xc02]._vptr_Renderer = (_func_int **)(pRVar12 + 0x401);
            pRVar12[0xc02].synth = (Synth *)(pRVar12 + 0x601);
            pRVar12[0xc03]._vptr_Renderer = (_func_int **)(pRVar12 + 0x801);
            pRVar12[0xc03].synth = (Synth *)(pRVar12 + 0xa01);
          }
          else {
            if (RVar2 != RendererType_FLOAT) {
              printDebug(this,"Synth: Unknown renderer type %i\n");
              goto LAB_0015d14d;
            }
            pRVar12 = (Renderer *)operator_new(0x18040);
            pRVar12->synth = this;
            pRVar12->_vptr_Renderer = (_func_int **)&PTR__Renderer_001aae28;
            pRVar12[0x1801]._vptr_Renderer = (_func_int **)(pRVar12 + 1);
            pRVar12[0x1801].synth = (Synth *)(pRVar12 + 0x401);
            pRVar12[0x1802]._vptr_Renderer = (_func_int **)(pRVar12 + 0x801);
            pRVar12[0x1802].synth = (Synth *)(pRVar12 + 0xc01);
            pRVar12[0x1803]._vptr_Renderer = (_func_int **)(pRVar12 + 0x1001);
            pRVar12[0x1803].synth = (Synth *)(pRVar12 + 0x1401);
          }
          this->renderer = pRVar12;
          this_04 = (Display *)operator_new(0x70);
          Display::Display(this_04,this);
          pEVar5 = this->extensions;
          pEVar5->display = this_04;
          pEVar5->oldMT32DisplayFeatures =
               (bool)((byte)((ushort)*(undefined2 *)this->controlROMFeatures >> 9) & 1);
          this->opened = true;
          this->activated = false;
          return (int)CONCAT71((uint7)((ulong)in_R8 >> 8) & 0xffffff,1);
        }
      }
      dispose(this);
      return 0;
    }
    printDebug(this,"Init Error - Missing PCM ROM image");
    (*this->reportHandler->_vptr_ReportHandler[4])();
  }
  else {
    printDebug(this,"Init Error - Missing or invalid Control ROM image");
    (*this->reportHandler->_vptr_ReportHandler[3])();
  }
LAB_0015d14d:
  dispose(this);
  return 0;
}

Assistant:

bool Synth::open(const ROMImage &controlROMImage, const ROMImage &pcmROMImage, Bit32u usePartialCount, AnalogOutputMode analogOutputMode) {
	if (opened) {
		return false;
	}
	partialCount = usePartialCount;
	abortingPoly = NULL;
	extensions.abortingPartIx = 0;

	// This is to help detect bugs
	memset(&mt32ram, '?', sizeof(mt32ram));

#if MT32EMU_MONITOR_INIT
	printDebug("Loading Control ROM");
#endif
	if (!loadControlROM(controlROMImage)) {
		printDebug("Init Error - Missing or invalid Control ROM image");
		reportHandler->onErrorControlROM();
		dispose();
		return false;
	}

	initMemoryRegions();

	// 512KB PCM ROM for MT-32, etc.
	// 1MB PCM ROM for CM-32L, LAPC-I, CM-64, CM-500
	// Note that the size below is given in samples (16-bit), not bytes
	pcmROMSize = controlROMMap->pcmCount == 256 ? 512 * 1024 : 256 * 1024;
	pcmROMData = new Bit16s[pcmROMSize];

#if MT32EMU_MONITOR_INIT
	printDebug("Loading PCM ROM");
#endif
	if (!loadPCMROM(pcmROMImage)) {
		printDebug("Init Error - Missing PCM ROM image");
		reportHandler->onErrorPCMROM();
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Reverb Models");
#endif
	bool mt32CompatibleReverb = controlROMFeatures->defaultReverbMT32Compatible;
#if MT32EMU_MONITOR_INIT
	printDebug("Using %s Compatible Reverb Models", mt32CompatibleReverb ? "MT-32" : "CM-32L");
#endif
	initReverbModels(mt32CompatibleReverb);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank A");
#endif
	if (!initTimbres(controlROMMap->timbreAMap, controlROMMap->timbreAOffset, 0x40, 0, controlROMMap->timbreACompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank B");
#endif
	if (!initTimbres(controlROMMap->timbreBMap, controlROMMap->timbreBOffset, 0x40, 64, controlROMMap->timbreBCompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank R");
#endif
	if (!initTimbres(controlROMMap->timbreRMap, 0, controlROMMap->timbreRCount, 192, true)) {
		dispose();
		return false;
	}

	if (controlROMMap->timbreRCount == 30) {
		// We must initialise all 64 rhythm timbres to avoid undefined behaviour.
		// SEMI-CONFIRMED: Old-gen MT-32 units likely map timbres 30..59 to 0..29.
		// Attempts to play rhythm timbres 60..63 exhibit undefined behaviour.
		// We want to emulate the wrap around, so merely copy the entire set of standard
		// timbres once more. The last 4 dangerous timbres are zeroed out.
		memcpy(&mt32ram.timbres[222], &mt32ram.timbres[192], sizeof(*mt32ram.timbres) * 30);
		memset(&mt32ram.timbres[252], 0, sizeof(*mt32ram.timbres) * 4);
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank M");
#endif
	// CM-64 seems to initialise all bytes in this bank to 0.
	memset(&mt32ram.timbres[128], 0, sizeof(mt32ram.timbres[128]) * 64);

	partialManager = new PartialManager(this, parts);

	pcmWaves = new PCMWaveEntry[controlROMMap->pcmCount];

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising PCM List");
#endif
	initPCMList(controlROMMap->pcmTable, controlROMMap->pcmCount);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Rhythm Temp");
#endif
	memcpy(mt32ram.rhythmTemp, &controlROMData[controlROMMap->rhythmSettings], controlROMMap->rhythmSettingsCount * 4);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Patches");
#endif
	for (Bit8u i = 0; i < 128; i++) {
		PatchParam *patch = &mt32ram.patches[i];
		patch->timbreGroup = i / 64;
		patch->timbreNum = i % 64;
		patch->keyShift = 24;
		patch->fineTune = 50;
		patch->benderRange = 12;
		patch->assignMode = 0;
		patch->reverbSwitch = 1;
		patch->dummy = 0;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising System");
#endif
	// The MT-32 manual claims that "Standard pitch" is 442Hz.
	mt32ram.system.masterTune = 0x4A; // Confirmed on CM-64
	mt32ram.system.reverbMode = 0; // Confirmed
	mt32ram.system.reverbTime = 5; // Confirmed
	mt32ram.system.reverbLevel = 3; // Confirmed
	memcpy(mt32ram.system.reserveSettings, &controlROMData[controlROMMap->reserveSettings], 9); // Confirmed
	for (Bit8u i = 0; i < 9; i++) {
		// This is the default: {1, 2, 3, 4, 5, 6, 7, 8, 9}
		// An alternative configuration can be selected by holding "Master Volume"
		// and pressing "PART button 1" on the real MT-32's frontpanel.
		// The channel assignment is then {0, 1, 2, 3, 4, 5, 6, 7, 9}
		mt32ram.system.chanAssign[i] = i + 1;
	}
	mt32ram.system.masterVol = 100; // Confirmed

	bool oldReverbOverridden = reverbOverridden;
	reverbOverridden = false;
	refreshSystem();
	resetMasterTunePitchDelta();
	reverbOverridden = oldReverbOverridden;

	char(*writableSoundGroupNames)[9] = new char[controlROMMap->soundGroupsCount][9];
	soundGroupNames = writableSoundGroupNames;
	initSoundGroups(writableSoundGroupNames);

	for (int i = 0; i < 9; i++) {
		MemParams::PatchTemp *patchTemp = &mt32ram.patchTemp[i];

		// Note that except for the rhythm part, these patch fields will be set in setProgram() below anyway.
		patchTemp->patch.timbreGroup = 0;
		patchTemp->patch.timbreNum = 0;
		patchTemp->patch.keyShift = 24;
		patchTemp->patch.fineTune = 50;
		patchTemp->patch.benderRange = 12;
		patchTemp->patch.assignMode = 0;
		patchTemp->patch.reverbSwitch = 1;
		patchTemp->patch.dummy = 0;

		patchTemp->outputLevel = 80;
		patchTemp->panpot = controlROMData[controlROMMap->panSettings + i];
		memset(patchTemp->dummyv, 0, sizeof(patchTemp->dummyv));
		patchTemp->dummyv[1] = 127;

		if (i < 8) {
			parts[i] = new Part(this, i);
			parts[i]->setProgram(controlROMData[controlROMMap->programSettings + i]);
		} else {
			parts[i] = new RhythmPart(this, i);
		}
	}

	// For resetting mt32 mid-execution
	mt32default = mt32ram;

	midiQueue = new MidiEventQueue(extensions.midiEventQueueSize, extensions.midiEventQueueSysexStorageBufferSize);

	analog = Analog::createAnalog(analogOutputMode, controlROMFeatures->oldMT32AnalogLPF, getSelectedRendererType());
#if MT32EMU_MONITOR_INIT
	static const char *ANALOG_OUTPUT_MODES[] = { "Digital only", "Coarse", "Accurate", "Oversampled2x" };
	printDebug("Using Analog output mode %s", ANALOG_OUTPUT_MODES[analogOutputMode]);
#endif
	setOutputGain(outputGain);
	setReverbOutputGain(reverbOutputGain);

	switch (getSelectedRendererType()) {
		case RendererType_BIT16S:
			renderer = new RendererImpl<IntSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using integer 16-bit samples in renderer and wave generator");
#endif
			break;
		case RendererType_FLOAT:
			renderer = new RendererImpl<FloatSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using float 32-bit samples in renderer and wave generator");
#endif
			break;
		default:
			printDebug("Synth: Unknown renderer type %i\n", getSelectedRendererType());
			dispose();
			return false;
	}

	extensions.display = new Display(*this);
	extensions.oldMT32DisplayFeatures = controlROMFeatures->oldMT32DisplayFeatures;

	opened = true;
	activated = false;

#if MT32EMU_MONITOR_INIT
	printDebug("*** Initialisation complete ***");
#endif
	return true;
}